

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_pow(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  char *in_RCX;
  CVmObjBigNum *in_RDI;
  int units_dig;
  size_t idx;
  int result_neg;
  err_frame_t err_cur__;
  char *ext2;
  char *ext1;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *new_ext;
  char *val2_ext;
  vm_val_t val2;
  char **ppcVar9;
  undefined4 uVar10;
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  char *pcVar11;
  vm_val_t *in_stack_fffffffffffffe70;
  char **in_stack_fffffffffffffe78;
  uint *in_stack_fffffffffffffe80;
  vm_val_t *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  uint local_15c;
  size_t local_158;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_ffffffffffffff98;
  uint local_58;
  uint local_54;
  size_t local_50;
  char *local_40 [2];
  char *in_stack_ffffffffffffffd0;
  
  ppcVar9 = local_40;
  uVar10 = 0;
  iVar1 = setup_getp_1(in_RDI,(vm_obj_id_t)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,in_stack_fffffffffffffe70,
                       (char **)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffeb8);
  if (iVar1 != 0) {
    return 1;
  }
  local_50 = get_prec((char *)0x2b49e8);
  iVar1 = is_zero((in_RDI->super_CVmObject).ext_);
  if (iVar1 != 0) {
    iVar1 = is_zero(local_40[0]);
    if (iVar1 != 0) {
      err_throw(0);
    }
    iVar1 = get_neg(local_40[0]);
    if (iVar1 != 0) {
      err_throw(0);
    }
    set_zero((char *)CONCAT44(in_stack_fffffffffffffe64,uVar10));
    goto LAB_002b4d64;
  }
  alloc_temp_regs(local_50 + 3,2,&stack0xffffffffffffffa0,&local_54,&stack0xffffffffffffff98,
                  &local_58,ppcVar9);
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  pcVar11 = (char *)*puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)&stack0xfffffffffffffeb8;
  uVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffed0);
  if (uVar2 == 0) {
    iVar1 = get_neg((in_RDI->super_CVmObject).ext_);
    if (iVar1 == 0) {
      compute_ln_into(in_RCX,in_stack_ffffffffffffffd0);
      uVar3 = 0;
    }
    else {
      copy_val((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64
              );
      set_neg(in_stack_ffffffffffffff98,0);
      iVar1 = get_exp((char *)0x2b4b08);
      if (iVar1 < 0) {
        local_158 = 0;
      }
      else {
        iVar1 = get_exp((char *)0x2b4b23);
        local_158 = (size_t)iVar1;
      }
      while (sVar8 = local_158, sVar6 = get_prec((char *)0x2b4b4b), sVar8 < sVar6) {
        uVar3 = get_dig(local_40[0],local_158);
        if (uVar3 != 0) {
          err_throw(0);
        }
        local_158 = local_158 + 1;
      }
      iVar1 = get_exp((char *)0x2b4b98);
      if (iVar1 < 1) {
LAB_002b4bcb:
        local_15c = 0;
      }
      else {
        iVar1 = get_exp((char *)0x2b4baa);
        uVar7 = (ulong)iVar1;
        sVar8 = get_prec((char *)0x2b4bbe);
        if (sVar8 < uVar7) goto LAB_002b4bcb;
        iVar1 = get_exp((char *)0x2b4bef);
        local_15c = get_dig(local_40[0],(long)iVar1 - 1);
      }
      uVar3 = (uint)((local_15c & 1) != 0);
      compute_ln_into(in_RCX,in_stack_ffffffffffffffd0);
    }
    compute_prod_into(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,pcVar11);
    compute_exp_into((char *)err_cur__.jmpbuf_[0].__jmpbuf[0],(char *)err_cur__.exc_);
    if (uVar3 != 0) {
      negate((char *)CONCAT44(in_stack_fffffffffffffe64,uVar10));
    }
    copy_val((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  }
  if ((uVar2 & 0x8000) == 0) {
    release_temp_regs(2,(ulong)local_54,(ulong)local_58);
  }
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = pcVar11;
  if ((uVar2 & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    pcVar11 = in_stack_fffffffffffffec8;
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
      pcVar11 = in_stack_fffffffffffffec8;
    }
    in_stack_fffffffffffffec8 = pcVar11;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(char **)(*plVar5 + 0x10) = pcVar11;
    err_rethrow();
  }
  if ((uVar2 & 2) != 0) {
    free(in_stack_fffffffffffffec8);
  }
LAB_002b4d64:
  CVmStack::discard(2);
  return 1;
}

Assistant:

int CVmObjBigNum::getp_pow(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *val2_ext;
    char *new_ext;
    size_t prec;
    uint hdl1, hdl2;
    char *ext1, *ext2;

    /* check arguments and allocate the result value */
    if (setup_getp_1(vmg_ self, retval, argc, &new_ext,
                     &val2, &val2_ext, FALSE))
        return TRUE;

    /* use the precision of the result */
    prec = get_prec(new_ext);
    
    /* 
     *   Check for a special case: if the number we're exponentiating is
     *   zero, the result is 0 for any positive exponent, and an error for
     *   any non-positive exponent (0^0 is undefined, and 0^n where n<0 is
     *   equivalent to 1/0^n == 1/0, which is a divide-by-zero error).  
     */
    if (is_zero(ext_))
    {
        /* 0^0 is undefined */
        if (is_zero(val2_ext))
            err_throw(VMERR_OUT_OF_RANGE);

        /* 0^negative is a divide by zero error */
        if (get_neg(val2_ext))
            err_throw(VMERR_DIVIDE_BY_ZERO);
        
        /* set the result to one, and we're done */
        set_zero(new_ext);
        goto done;
    }

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 2,
                    &ext1, &hdl1, &ext2, &hdl2);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        int result_neg;
        
        /*
         *   If a = e^b, then b = ln(a).  This means that x^y = e^ln(x^y)
         *   = e^(y * ln(x)).  So, we can compute the result in terms of
         *   natural logarithm and exponentiation of 'e', for which we
         *   have primitives we can call.  
         */

        /*
         *   If x is negative, we can only exponentiate the value to
         *   integer powers.  In this case, we can substitute x' = -x
         *   (hence x' will be positive), and rewrite the expression as
         *   
         *   (-1)^y * (x')^y
         *   
         *   We can only calculate (-1)^y for integer values of y, since
         *   the result is complex if y is not an integer.  
         */
        if (get_neg(ext_))
        {
            size_t idx;
            int units_dig;
            
            /* copy x into r2 */
            copy_val(ext2, ext_, FALSE);

            /* 
             *   calculate x' = (-x) - since x is negative, this will
             *   guarantee that x' is positive 
             */
            set_neg(ext2, FALSE);

            /* 
             *   make sure y is an integer - start at the first digit
             *   after the decimal point and check for any non-zero digits 
             */
            idx = (get_exp(val2_ext) < 0 ? 0 : (size_t)get_exp(val2_ext));
            for ( ; idx < get_prec(val2_ext) ; ++idx)
            {
                /* if this digit isn't a zero, it's not an integer */
                if (get_dig(val2_ext, idx) != 0)
                {
                    /* y isn't an integer, so we can't calculate (-1)^y */
                    err_throw(VMERR_OUT_OF_RANGE);
                }
            }

            /* get the first digit to the left of the decimal point */
            if (get_exp(val2_ext) <= 0
                || (size_t)get_exp(val2_ext) > get_prec(val2_ext))
            {
                /* the units digit isn't represented - zero is implied */
                units_dig = 0;
            }
            else
            {
                /* get the digit */
                units_dig = get_dig(val2_ext, (size_t)get_exp(val2_ext) - 1);
            }

            /* 
             *   if the units digit is even, the result will be positive;
             *   if it's odd, the result will be negative 
             */
            result_neg = ((units_dig & 1) != 0);

            /* calculate ln(x') into r1 */
            compute_ln_into(ext1, ext2);
        }
        else
        {
            /* calculate ln(x) into r1 */
            compute_ln_into(ext1, ext_);

            /* the result will be positive */
            result_neg = FALSE;
        }

        /* calculate y * ln(x) into r2 */
        compute_prod_into(ext2, val2_ext, ext1);

        /* calculate exp(r2) = exp(y*ln(x)) = x^y into r1 */
        compute_exp_into(ext1, ext2);

        /* negate the result if we had a negative x and an odd power */
        if (result_neg)
            negate(ext1);

        /* save the result, rounding as needed */
        copy_val(new_ext, ext1, TRUE);
    }